

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcontrollers.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CSynchStateController::DecrementOwnershipCount(CSynchStateController *this)

{
  uint uVar1;
  POwnedObjectsListNode pooln;
  long lVar2;
  CPalThread *pCVar3;
  CSynchData *pCVar4;
  PAL_ERROR PVar5;
  
  uVar1 = ((this->super_CSynchControllerBase).m_psdSynchData)->m_lOwnershipCount;
  pCVar3 = InternalGetCurrentThread();
  if (pCVar3 != (this->super_CSynchControllerBase).m_pthrOwner) {
    fprintf(_stderr,"] %s %s:%d","DecrementOwnershipCount",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x2a4);
    fprintf(_stderr,"Expression: InternalGetCurrentThread() == m_pthrOwner\n");
  }
  if (((this->super_CSynchControllerBase).m_potObjectType)->m_eOwnershipSemantics !=
      OwnershipTracked) {
    fprintf(_stderr,"] %s %s:%d","DecrementOwnershipCount",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x2a8);
    fprintf(_stderr,
            "Expression: CObjectType::OwnershipTracked == m_potObjectType->GetOwnershipSemantics(), Description: Trying to decrement ownership count on an object with ownership semantics other than OwnershipTracked\n"
           );
  }
  if ((int)uVar1 < 0) {
    fprintf(_stderr,"] %s %s:%d","DecrementOwnershipCount",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
            ,0x2ac);
    fprintf(_stderr,
            "Expression: 0 <= lOwnershipCount, Description: Operation would make ownership count negative - object should be owned at this time [ownership count=%d]\n"
            ,(ulong)uVar1);
    PVar5 = 0x120;
  }
  else {
    PVar5 = 0x120;
    if (((uVar1 != 0) &&
        (pCVar4 = (this->super_CSynchControllerBase).m_psdSynchData, pCVar4->m_dwOwnerPid == gPID))
       && (pCVar4->m_pOwnerThread == (this->super_CSynchControllerBase).m_pthrOwner)) {
      PVar5 = 0;
      pCVar4->m_lOwnershipCount = uVar1 - 1;
      lVar2 = CPalSynchronizationManager::s_pObjSynchMgr;
      if (uVar1 - 1 == 0) {
        pooln = pCVar4->m_poolnOwnedObjectListNode;
        if (pooln == (POwnedObjectsListNode)0x0) {
          fprintf(_stderr,"] %s %s:%d","DecrementOwnershipCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                  ,0x2c2);
          fprintf(_stderr,
                  "Expression: NULL != pooln, Description: Null ownership node pointer in SynchData with ownership semantics\n"
                 );
          pCVar4 = (this->super_CSynchControllerBase).m_psdSynchData;
        }
        if (pCVar4 != pooln->pPalObjSynchData) {
          fprintf(_stderr,"] %s %s:%d","DecrementOwnershipCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchcontrollers.cpp"
                  ,0x2c4);
          fprintf(_stderr,
                  "Expression: m_psdSynchData == pooln->pPalObjSynchData, Description: Corrupted ownership node\n"
                 );
        }
        CThreadSynchronizationInfo::RemoveObjectFromOwnedList
                  (&((this->super_CSynchControllerBase).m_pthrOwner)->synchronizationInfo,pooln);
        CSynchData::Release((this->super_CSynchControllerBase).m_psdSynchData,
                            (this->super_CSynchControllerBase).m_pthrOwner);
        CSynchCache<CorUnix::_OwnedObjectsListNode>::Add
                  ((CSynchCache<CorUnix::_OwnedObjectsListNode> *)(lVar2 + 0x4d8),
                   (this->super_CSynchControllerBase).m_pthrOwner,pooln);
        pCVar4 = (this->super_CSynchControllerBase).m_psdSynchData;
        pCVar4->m_lOwnershipCount = 0;
        pCVar4->m_dwOwnerPid = 0;
        pCVar4->m_dwOwnerTid = 0;
        pCVar4->m_pOwnerThread = (CPalThread *)0x0;
        pCVar4->m_poolnOwnedObjectListNode = (OwnedObjectsListNode *)0x0;
        PVar5 = 0;
        CSynchData::Signal(pCVar4,(this->super_CSynchControllerBase).m_pthrOwner,1,false);
      }
    }
  }
  return PVar5;
}

Assistant:

PAL_ERROR CSynchStateController::DecrementOwnershipCount()
    {
        VALIDATEOBJECT(m_psdSynchData);
        
        PAL_ERROR palErr = NO_ERROR;
        LONG lOwnershipCount = m_psdSynchData->GetOwnershipCount();

        _ASSERTE(InternalGetCurrentThread() == m_pthrOwner);
        _ASSERT_MSG(CObjectType::OwnershipTracked == 
                    m_potObjectType->GetOwnershipSemantics(),
                    "Trying to decrement ownership count on an object with "
                    "ownership semantics other than OwnershipTracked\n");
        _ASSERT_MSG(0 <= lOwnershipCount,
                    "Operation would make ownership count negative - object "
                    "should be owned at this time [ownership count=%d]\n", 
                    lOwnershipCount);
        
        if ( (1 > lOwnershipCount) || 
             (m_psdSynchData->GetOwnerProcessID() != gPID) ||
             (m_psdSynchData->GetOwnerThread() != m_pthrOwner) )
        {
            palErr = ERROR_NOT_OWNER;
            goto DOC_exit;            
        }

        lOwnershipCount--;
        m_psdSynchData->SetOwnershipCount(lOwnershipCount);

        if (0 == lOwnershipCount)
        {
            CPalSynchronizationManager * pSynchManager = 
                CPalSynchronizationManager::GetInstance();
            OwnedObjectsListNode * pooln =
                m_psdSynchData->GetOwnershipListNode();

            _ASSERT_MSG(NULL != pooln, 
                        "Null ownership node pointer in SynchData with ownership "
                        "semantics\n");
            _ASSERT_MSG(m_psdSynchData == pooln->pPalObjSynchData, 
                        "Corrupted ownership node\n");

            // Object has been released
            // Remove it from list of owned objs for current thread
            m_pthrOwner->synchronizationInfo.RemoveObjectFromOwnedList(pooln);

            // Release SynchData reference count implied by the ownership 
            // list node
            m_psdSynchData->Release(m_pthrOwner);

            // Return node to the cache
            pSynchManager->CacheAddOwnedObjsListNode(m_pthrOwner, pooln);

            // Reset ownership
            m_psdSynchData->ResetOwnership();             
            
            // Signal it and trigger waiter thread awakening
            m_psdSynchData->Signal(m_pthrOwner, 1, false);
        }
                
    DOC_exit:
        return palErr;
    }